

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O3

lzma_ret block_encode_normal(lzma_block *block,lzma_allocator *allocator,uint8_t *in,size_t in_size,
                            uint8_t *out,size_t *out_pos,size_t out_size)

{
  size_t sVar1;
  ulong uVar2;
  lzma_ret lVar3;
  lzma_ret lVar4;
  size_t sVar5;
  size_t sVar6;
  size_t in_pos;
  lzma_next_coder raw_encoder;
  
  lVar3 = lzma_block_header_size(block);
  if (lVar3 == LZMA_OK) {
    sVar1 = *out_pos;
    lVar3 = LZMA_BUF_ERROR;
    if ((ulong)block->header_size < out_size - sVar1) {
      sVar5 = block->header_size + sVar1;
      *out_pos = sVar5;
      uVar2 = block->compressed_size;
      raw_encoder.coder = (void *)0x0;
      raw_encoder.get_check = (_func_lzma_check_void_ptr *)0x0;
      raw_encoder.memconfig = (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
      raw_encoder.end = (lzma_end_function)0x0;
      raw_encoder.get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
      raw_encoder.init = 0;
      raw_encoder.code = (lzma_code_function)0x0;
      raw_encoder.update =
           (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
      raw_encoder.id = 0xffffffffffffffff;
      lVar3 = lzma_raw_encoder_init(&raw_encoder,allocator,block->filters);
      if (lVar3 == LZMA_OK) {
        sVar6 = sVar5 + uVar2;
        if (out_size - sVar5 <= uVar2) {
          sVar6 = out_size;
        }
        in_pos = 0;
        lVar3 = (*raw_encoder.code)(raw_encoder.coder,allocator,in,&in_pos,in_size,out,out_pos,sVar6
                                    ,LZMA_FINISH);
      }
      lzma_next_end(&raw_encoder,allocator);
      if (lVar3 == LZMA_OK) {
        lVar3 = LZMA_BUF_ERROR;
      }
      else if (lVar3 == LZMA_STREAM_END) {
        block->compressed_size = *out_pos - (block->header_size + sVar1);
        lVar4 = lzma_block_header_encode(block,out + sVar1);
        lVar3 = LZMA_PROG_ERROR;
        if (lVar4 == LZMA_OK) {
          return LZMA_OK;
        }
      }
      *out_pos = sVar1;
    }
  }
  return lVar3;
}

Assistant:

static lzma_ret
block_encode_normal(lzma_block *block, const lzma_allocator *allocator,
		const uint8_t *in, size_t in_size,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	// Find out the size of the Block Header.
	return_if_error(lzma_block_header_size(block));

	// Reserve space for the Block Header and skip it for now.
	if (out_size - *out_pos <= block->header_size)
		return LZMA_BUF_ERROR;

	const size_t out_start = *out_pos;
	*out_pos += block->header_size;

	// Limit out_size so that we stop encoding if the output would grow
	// bigger than what uncompressed Block would be.
	if (out_size - *out_pos > block->compressed_size)
		out_size = *out_pos + block->compressed_size;

	// TODO: In many common cases this could be optimized to use
	// significantly less memory.
	lzma_next_coder raw_encoder = LZMA_NEXT_CODER_INIT;
	lzma_ret ret = lzma_raw_encoder_init(
			&raw_encoder, allocator, block->filters);

	if (ret == LZMA_OK) {
		size_t in_pos = 0;
		ret = raw_encoder.code(raw_encoder.coder, allocator,
				in, &in_pos, in_size, out, out_pos, out_size,
				LZMA_FINISH);
	}

	// NOTE: This needs to be run even if lzma_raw_encoder_init() failed.
	lzma_next_end(&raw_encoder, allocator);

	if (ret == LZMA_STREAM_END) {
		// Compression was successful. Write the Block Header.
		block->compressed_size
				= *out_pos - (out_start + block->header_size);
		ret = lzma_block_header_encode(block, out + out_start);
		if (ret != LZMA_OK)
			ret = LZMA_PROG_ERROR;

	} else if (ret == LZMA_OK) {
		// Output buffer became full.
		ret = LZMA_BUF_ERROR;
	}

	// Reset *out_pos if something went wrong.
	if (ret != LZMA_OK)
		*out_pos = out_start;

	return ret;
}